

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::generateIterations
          (TextureGatherCubeCase *this)

{
  TextureFormat *textureFormat;
  undefined8 *puVar1;
  int *piVar2;
  GatherType gatherType;
  ChannelOrder CVar3;
  pointer pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  CubeFace CVar12;
  ulong uVar13;
  long lVar14;
  undefined1 local_78 [48];
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  textureFormat = &(this->super_TextureGatherCase).m_textureFormat;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_78);
  generateBasic2DCaseIterations(&basicIterations,gatherType,textureFormat,(IVec2 *)local_78);
  uVar10 = ((long)basicIterations.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)basicIterations.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  uVar13 = 0;
  uVar11 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar11 = uVar13;
  }
  do {
    CVar12 = (CubeFace)uVar13;
    if (CVar12 == CUBEFACE_NEGATIVE_X) {
      for (lVar14 = 0; uVar11 * 0x24 - lVar14 != 0; lVar14 = lVar14 + 0x24) {
        local_78._16_8_ = (pointer)0x0;
        local_78._24_8_ = 0;
        local_78._0_8_ = (_func_int **)0x0;
        local_78._8_8_ = (TestContext *)0x0;
        local_78._32_8_ = 0;
        GatherArgs::GatherArgs((GatherArgs *)local_78);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
        ::push_back(&this->m_iterations,(value_type *)local_78);
        pIVar4 = (this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar4[-1].gatherArgs.offsets[3].m_data[1] =
             *(int *)((long)(basicIterations.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                             ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                     lVar14 + 4);
        piVar2 = (int *)((long)(basicIterations.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                        lVar14 + -4);
        iVar5 = *piVar2;
        iVar6 = piVar2[1];
        iVar7 = piVar2[2];
        iVar8 = piVar2[3];
        puVar1 = (undefined8 *)
                 ((long)(basicIterations.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                         ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data + lVar14 + 4)
        ;
        uVar9 = puVar1[1];
        *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[1].m_data + 1) = *puVar1;
        *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[2].m_data + 1) = uVar9;
        pIVar4[-1].gatherArgs.componentNdx = iVar5;
        pIVar4[-1].gatherArgs.offsets[0].m_data[0] = iVar6;
        pIVar4[-1].gatherArgs.offsets[0].m_data[1] = iVar7;
        pIVar4[-1].gatherArgs.offsets[1].m_data[0] = iVar8;
        (this->m_iterations).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].face = CUBEFACE_NEGATIVE_X;
      }
    }
    else {
      if (CVar12 == CUBEFACE_LAST) {
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::~vector(&basicIterations);
        return;
      }
      CVar3 = textureFormat->order;
      for (lVar14 = 0; uVar11 * 0x24 - lVar14 != 0; lVar14 = lVar14 + 0x24) {
        if (((CVar3 == D) || (CVar3 == DS)) ||
           (*(CubeFace *)
             ((long)(basicIterations.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                     ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data + lVar14 + -4) ==
            (CVar12 & CUBEFACE_POSITIVE_Y))) {
          local_78._16_8_ = (pointer)0x0;
          local_78._24_8_ = 0;
          local_78._0_8_ = (_func_int **)0x0;
          local_78._8_8_ = (TestContext *)0x0;
          local_78._32_8_ = 0;
          GatherArgs::GatherArgs((GatherArgs *)local_78);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)local_78);
          pIVar4 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar4[-1].gatherArgs.offsets[3].m_data[1] =
               *(int *)((long)(basicIterations.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                               ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                       lVar14 + 4);
          piVar2 = (int *)((long)(basicIterations.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                          lVar14 + -4);
          iVar5 = *piVar2;
          iVar6 = piVar2[1];
          iVar7 = piVar2[2];
          iVar8 = piVar2[3];
          puVar1 = (undefined8 *)
                   ((long)(basicIterations.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                           ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data +
                   lVar14 + 4);
          uVar9 = puVar1[1];
          *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[1].m_data + 1) = *puVar1;
          *(undefined8 *)(pIVar4[-1].gatherArgs.offsets[2].m_data + 1) = uVar9;
          pIVar4[-1].gatherArgs.componentNdx = iVar5;
          pIVar4[-1].gatherArgs.offsets[0].m_data[0] = iVar6;
          pIVar4[-1].gatherArgs.offsets[0].m_data[1] = iVar7;
          pIVar4[-1].gatherArgs.offsets[1].m_data[0] = iVar8;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].face = CVar12;
          break;
        }
      }
    }
    uVar13 = (ulong)(CVar12 + CUBEFACE_POSITIVE_X);
  } while( true );
}

Assistant:

void TextureGatherCubeCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}
}